

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_short_edges(REF_GRID ref_grid,REF_DBL ratio_tol)

{
  REF_INT node0_00;
  REF_INT node1_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  char filename [1024];
  REF_DBL edge_ratio;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT ntarget;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_DBL ratio_tol_local;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node = (REF_NODE)ratio_tol;
  ratio_tol_local = (REF_DBL)ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&node0,ref_grid);
  if (uVar1 == 0) {
    node1 = 0;
    for (edge_ratio._0_4_ = 0; edge_ratio._0_4_ < _node0->n; edge_ratio._0_4_ = edge_ratio._0_4_ + 1
        ) {
      if (99 < node1) {
        printf("over 100 short edges, giving up\n");
        break;
      }
      node0_00 = _node0->e2n[edge_ratio._0_4_ << 1];
      node1_00 = _node0->e2n[edge_ratio._0_4_ * 2 + 1];
      uVar1 = ref_node_ratio((REF_NODE)ref_edge,node0_00,node1_00,(REF_DBL *)(filename + 0x3f8));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x1cc,"ref_clump_short_edges",(ulong)uVar1,"ratio");
        return uVar1;
      }
      if ((double)filename._1016_8_ <
          (double)ref_node * *(double *)(*(long *)((long)ratio_tol_local + 0xa8) + 0x20)) {
        snprintf((char *)&ref_private_macro_code_rss_1,0x400,"clump%d.t",(ulong)(uint)node1);
        uVar1 = ref_clump_between((REF_GRID)ratio_tol_local,node0_00,node1_00,
                                  (char *)&ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x1cf,"ref_clump_short_edges",(ulong)uVar1,"dump");
          return uVar1;
        }
        node1 = node1 + 1;
      }
    }
    ref_grid_local._4_4_ = ref_edge_free(_node0);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1d4
             ,"ref_clump_short_edges",(ulong)ref_grid_local._4_4_,"free edges");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1c2,
           "ref_clump_short_edges",(ulong)uVar1,"orig edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_short_edges(REF_GRID ref_grid, REF_DBL ratio_tol) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT ntarget;
  REF_INT node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ntarget = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ntarget >= 100) {
      printf("over 100 short edges, giving up\n");
      break;
    }
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio < ratio_tol * ref_grid_adapt(ref_grid, collapse_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_between(ref_grid, node0, node1, filename), "dump");
      ntarget++;
    }
  }

  RSS(ref_edge_free(ref_edge), "free edges");

  return REF_SUCCESS;
}